

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O3

void BrotliBuildCodeLengthsHuffmanTable(HuffmanCode *table,uint8_t *code_lengths,uint16_t *count)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  HuffmanCode *pHVar8;
  HuffmanCode HVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  int local_c8 [4];
  int local_b8;
  int local_b4;
  int local_ac;
  ulong local_a8;
  HuffmanCode *local_a0;
  uint16_t *local_98;
  long local_90;
  HuffmanCode *local_88;
  int offset [6];
  
  auVar6 = _DAT_00109210;
  auVar5 = _DAT_00109200;
  auVar4 = _DAT_001091f0;
  local_c8[1] = count[1] - 1;
  local_c8[2] = (uint)count[1] + (uint)count[2] + -1;
  local_c8[3] = (uint)count[3] + local_c8[2];
  local_b8 = (uint)count[4] + local_c8[3];
  local_98 = count;
  local_b4 = (uint)count[5] + local_b8;
  local_c8[0] = 0x11;
  lVar7 = 0;
  do {
    iVar2 = local_c8[code_lengths[lVar7 + 0x11]];
    local_c8[code_lengths[lVar7 + 0x11]] = iVar2 + -1;
    iVar16 = (int)lVar7;
    offset[(long)iVar2 + 2] = iVar16 + 0x11;
    iVar2 = local_c8[code_lengths[lVar7 + 0x10]];
    local_c8[code_lengths[lVar7 + 0x10]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0x10;
    iVar2 = local_c8[code_lengths[lVar7 + 0xf]];
    local_c8[code_lengths[lVar7 + 0xf]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0xf;
    iVar2 = local_c8[code_lengths[lVar7 + 0xe]];
    local_c8[code_lengths[lVar7 + 0xe]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0xe;
    iVar2 = local_c8[code_lengths[lVar7 + 0xd]];
    local_c8[code_lengths[lVar7 + 0xd]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0xd;
    iVar2 = local_c8[code_lengths[lVar7 + 0xc]];
    local_c8[code_lengths[lVar7 + 0xc]] = iVar2 + -1;
    offset[(long)iVar2 + 2] = iVar16 + 0xc;
    lVar7 = lVar7 + -6;
  } while (lVar7 != -0x12);
  if (local_c8[0] == 0) {
    lVar7 = 0;
    do {
      table[lVar7].bits = '\0';
      table[lVar7].value = (uint16_t)offset[2];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
  }
  else {
    local_ac = 2;
    lVar13 = 0;
    lVar11 = 1;
    lVar7 = 0;
    local_a8 = 0x80;
    local_a0 = table;
    do {
      uVar10 = (uint)local_98[lVar11];
      if (local_98[lVar11] != 0) {
        lVar12 = (long)-local_ac;
        lVar13 = (long)(int)lVar13;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = (long)local_ac;
        auVar18 = (ZEXT816(0) << 0x40 | ZEXT816(0x1f)) / auVar18;
        iVar2 = auVar18._0_4_;
        auVar15._0_8_ = auVar18._0_8_;
        auVar15._8_4_ = iVar2;
        auVar15._12_4_ = 0;
        local_88 = table + -(long)local_ac;
        offset[0] = (int)lVar12;
        offset[1] = (int)((ulong)lVar12 >> 0x20);
        local_90 = lVar12 * 8 + 0x80;
        auVar15 = auVar15 ^ auVar6;
        do {
          bVar1 = ""[lVar7];
          HVar9 = (HuffmanCode)(offset[lVar13 + 2] << 0x10 | (uint)lVar11);
          uVar3 = (ulong)bVar1;
          uVar14 = 0;
          pHVar8 = table + -(long)local_ac;
          do {
            auVar17._8_4_ = (int)uVar14;
            auVar17._0_8_ = uVar14;
            auVar17._12_4_ = (int)(uVar14 >> 0x20);
            auVar18 = (auVar17 | auVar5) ^ auVar6;
            iVar16 = auVar15._4_4_;
            if ((bool)(~(iVar16 < auVar18._4_4_ ||
                        auVar15._0_4_ < auVar18._0_4_ && auVar18._4_4_ == iVar16) & 1)) {
              pHVar8[uVar3 + 0x20] = HVar9;
            }
            if (auVar18._12_4_ <= auVar15._12_4_ &&
                (auVar18._8_4_ <= auVar15._8_4_ || auVar18._12_4_ != auVar15._12_4_)) {
              pHVar8[lVar12 + (ulong)bVar1 + 0x20] = HVar9;
            }
            auVar18 = (auVar17 | auVar4) ^ auVar6;
            iVar19 = auVar18._4_4_;
            if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar18._0_4_ <= auVar15._0_4_)) {
              pHVar8[uVar3 + lVar12 * 2 + 0x20] = HVar9;
              pHVar8[lVar12 * 3 + uVar3 + 0x20] = HVar9;
            }
            uVar14 = uVar14 + 4;
            pHVar8 = pHVar8 + lVar12 * 4;
          } while ((iVar2 + 4U & 0x3c) != uVar14);
          lVar13 = lVar13 + 1;
          lVar7 = lVar7 + local_a8;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      local_ac = local_ac * 2;
      local_a8 = local_a8 >> 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
  }
  return;
}

Assistant:

void BrotliBuildCodeLengthsHuffmanTable(HuffmanCode* table,
                                        const uint8_t* const code_lengths,
                                        uint16_t* count) {
  HuffmanCode code; /* current table entry */
  int symbol;       /* symbol index in original or sorted table */
  reg_t key;        /* prefix code */
  reg_t key_step;   /* prefix code addend */
  int step;         /* step size to replicate values in current table */
  int table_size;   /* size of current table */
  int sorted[BROTLI_CODE_LENGTH_CODES];  /* symbols sorted by code length */
  /* offsets in sorted table for each length */
  int offset[BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1];
  int bits;
  int bits_count;
  BROTLI_DCHECK(BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH <=
                BROTLI_REVERSE_BITS_MAX);

  /* generate offsets into sorted symbol table by code length */
  symbol = -1;
  bits = 1;
  BROTLI_REPEAT(BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH, {
    symbol += count[bits];
    offset[bits] = symbol;
    bits++;
  });
  /* Symbols with code length 0 are placed after all other symbols. */
  offset[0] = BROTLI_CODE_LENGTH_CODES - 1;

  /* sort symbols by length, by symbol order within each length */
  symbol = BROTLI_CODE_LENGTH_CODES;
  do {
    BROTLI_REPEAT(6, {
      symbol--;
      sorted[offset[code_lengths[symbol]]--] = symbol;
    });
  } while (symbol != 0);

  table_size = 1 << BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH;

  /* Special case: all symbols but one have 0 code length. */
  if (offset[0] == 0) {
    code.bits = 0;
    code.value = (uint16_t)sorted[0];
    for (key = 0; key < (reg_t)table_size; ++key) {
      table[key] = code;
    }
    return;
  }

  /* fill in table */
  key = 0;
  key_step = BROTLI_REVERSE_BITS_LOWEST;
  symbol = 0;
  bits = 1;
  step = 2;
  do {
    code.bits = (uint8_t)bits;
    for (bits_count = count[bits]; bits_count != 0; --bits_count) {
      code.value = (uint16_t)sorted[symbol++];
      ReplicateValue(&table[BrotliReverseBits(key)], step, table_size, code);
      key += key_step;
    }
    step <<= 1;
    key_step >>= 1;
  } while (++bits <= BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH);
}